

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_test.cc
# Opt level: O0

void __thiscall GraphTestVarInOutPathEscaping::Run(GraphTestVarInOutPathEscaping *this)

{
  Test *this_00;
  int iVar1;
  bool condition;
  int iVar2;
  Node *this_01;
  Edge *this_02;
  string local_80;
  allocator<char> local_49;
  string local_48;
  Edge *local_28;
  Edge *edge;
  int local_14;
  GraphTestVarInOutPathEscaping *pGStack_10;
  int fail_count;
  GraphTestVarInOutPathEscaping *this_local;
  
  pGStack_10 = this;
  local_14 = testing::Test::AssertionFailures(g_current_test);
  ManifestParserOptions::ManifestParserOptions((ManifestParserOptions *)((long)&edge + 4));
  AssertParse(&(this->super_GraphTest).super_StateTestWithBuiltinRules.state_,
              "build a$ b: cat no\'space with$ space$$ no\"space2\n",stack0xffffffffffffffe4);
  iVar1 = local_14;
  iVar2 = testing::Test::AssertionFailures(g_current_test);
  if (iVar1 == iVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"a b",&local_49);
    this_01 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_48);
    this_02 = Node::in_edge(this_01);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    this_00 = g_current_test;
    local_28 = this_02;
    Edge::EvaluateCommand_abi_cxx11_(&local_80,this_02,false);
    condition = std::operator==("cat \'no\'\\\'\'space\' \'with space$\' \'no\"space2\' > \'a b\'",
                                &local_80);
    testing::Test::Check
              (this_00,condition,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/graph_test.cc"
               ,0xe2,
               "\"cat \'no\'\\\\\'\'space\' \'with space$\' \'no\\\"space2\' > \'a b\'\" == edge->EvaluateCommand()"
              );
    std::__cxx11::string::~string((string *)&local_80);
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  return;
}

Assistant:

TEST_F(GraphTest, VarInOutPathEscaping) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"build a$ b: cat no'space with$ space$$ no\"space2\n"));

  Edge* edge = GetNode("a b")->in_edge();
#if _WIN32
  EXPECT_EQ("cat no'space \"with space$\" \"no\\\"space2\" > \"a b\"",
      edge->EvaluateCommand());
#else
  EXPECT_EQ("cat 'no'\\''space' 'with space$' 'no\"space2' > 'a b'",
      edge->EvaluateCommand());
#endif
}